

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

string * pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TypeName_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x656c676e61697254;
  in_RDI->_M_string_length = 8;
  (in_RDI->field_2)._M_local_buf[8] = '\0';
  return in_RDI;
}

Assistant:

static std::string TypeName() { return TGeo::TypeName(); }